

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O3

nvpair_t * nvpair_move_number_array(char *name,uint64_t *value,size_t nitems)

{
  int iVar1;
  int *piVar2;
  nvpair_t *pnVar3;
  
  if (value == (uint64_t *)0x0 || nitems == 0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
  }
  else {
    pnVar3 = nvpair_allocv(name,9,(uint64_t)value,nitems * 8,nitems);
    if (pnVar3 != (nvpair_t *)0x0) {
      return pnVar3;
    }
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    free(value);
    *piVar2 = iVar1;
  }
  return (nvpair_t *)0x0;
}

Assistant:

nvpair_t *
nvpair_move_number_array(const char *name, uint64_t *value, size_t nitems)
{
	nvpair_t *nvp;

	if (value == NULL || nitems == 0) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	nvp = nvpair_allocv(name, NV_TYPE_NUMBER_ARRAY,
	    (uint64_t)(uintptr_t)value, sizeof(value[0]) * nitems, nitems);
	if (nvp == NULL) {
		ERRNO_SAVE();
		nv_free(value);
		ERRNO_RESTORE();
	}

	return (nvp);
}